

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaErr4Line(xmlSchemaAbstractCtxtPtr ctxt,xmlErrorLevel errorLevel,int code,
                      xmlNodePtr node,int line,char *msg,xmlChar *str1,xmlChar *str2,xmlChar *str3,
                      xmlChar *str4)

{
  xmlSchemaParserCtxtPtr pctxt;
  char *f;
  unsigned_long l;
  xmlSchemaParserCtxtPtr pxStack_68;
  int col;
  char *file;
  xmlSchemaValidCtxtPtr vctxt;
  char *msg_local;
  xmlNodePtr pxStack_48;
  int line_local;
  xmlNodePtr node_local;
  int code_local;
  xmlErrorLevel errorLevel_local;
  xmlSchemaAbstractCtxtPtr ctxt_local;
  
  if (ctxt != (xmlSchemaAbstractCtxtPtr)0x0) {
    vctxt = (xmlSchemaValidCtxtPtr)msg;
    msg_local._4_4_ = line;
    pxStack_48 = node;
    node_local._0_4_ = code;
    node_local._4_4_ = errorLevel;
    _code_local = ctxt;
    if (ctxt->type == 2) {
      pxStack_68 = (xmlSchemaParserCtxtPtr)0x0;
      l._4_4_ = 0;
      if (line == 0) {
        if (((node == (xmlNodePtr)0x0) && (-1 < *(int *)((long)&ctxt[10].dummy + 4))) &&
           (*(long *)(ctxt + 0xc) != 0)) {
          pxStack_48 = *(xmlNodePtr *)(*(long *)(ctxt + 0xc) + 8);
        }
        if (((pxStack_48 == (xmlNodePtr)0x0) && (*(long *)(ctxt + 5) != 0)) &&
           (*(long *)(*(long *)(ctxt + 5) + 0x38) != 0)) {
          pxStack_68 = *(xmlSchemaParserCtxtPtr *)(*(long *)(*(long *)(ctxt + 5) + 0x38) + 8);
          if (*(long *)(ctxt + 0xc) == 0) {
            msg_local._4_4_ = *(int *)(*(long *)(*(long *)(ctxt + 5) + 0x38) + 0x34);
            l._4_4_ = *(int *)(*(long *)(*(long *)(ctxt + 5) + 0x38) + 0x38);
          }
          else {
            msg_local._4_4_ = *(int *)(*(long *)(ctxt + 0xc) + 0x10);
            l._4_4_ = 0;
          }
        }
      }
      else {
        pxStack_48 = (xmlNodePtr)0x0;
        if (*(long *)(ctxt + 3) == 0) {
          if ((*(long *)(ctxt + 5) != 0) && (*(long *)(*(long *)(ctxt + 5) + 0x38) != 0)) {
            pxStack_68 = *(xmlSchemaParserCtxtPtr *)(*(long *)(*(long *)(ctxt + 5) + 0x38) + 8);
          }
        }
        else {
          pxStack_68 = *(xmlSchemaParserCtxtPtr *)(*(long *)(ctxt + 3) + 0x88);
        }
      }
      file = (char *)ctxt;
      if ((*(long *)(ctxt + 0x15) != 0) &&
         ((pxStack_68 == (xmlSchemaParserCtxtPtr)0x0 || (msg_local._4_4_ == 0)))) {
        (**(code **)(ctxt + 0x15))(ctxt[0x15].dummy,&pctxt,&f);
        if (pxStack_68 == (xmlSchemaParserCtxtPtr)0x0) {
          pxStack_68 = pctxt;
        }
        if (msg_local._4_4_ == 0) {
          msg_local._4_4_ = (int)f;
        }
      }
      if ((pxStack_68 == (xmlSchemaParserCtxtPtr)0x0) && (*(long *)(file + 0x60) != 0)) {
        pxStack_68 = *(xmlSchemaParserCtxtPtr *)(file + 0x60);
      }
      xmlSchemaVErrFull((xmlSchemaValidCtxtPtr)file,pxStack_48,(int)node_local,node_local._4_4_,
                        (char *)pxStack_68,msg_local._4_4_,str1,str2,str3,l._4_4_,(char *)vctxt,str1
                        ,str2,str3,str4);
    }
    else if (ctxt->type == 1) {
      xmlSchemaPErrFull((xmlSchemaParserCtxtPtr)ctxt,node,code,errorLevel,(char *)0x0,0,str1,str2,
                        str3,0,msg,str1,str2,str3,str4);
    }
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(6,0)
xmlSchemaErr4Line(xmlSchemaAbstractCtxtPtr ctxt,
		  xmlErrorLevel errorLevel,
		  int code, xmlNodePtr node, int line, const char *msg,
		  const xmlChar *str1, const xmlChar *str2,
		  const xmlChar *str3, const xmlChar *str4)
{
    if (ctxt != NULL) {
	if (ctxt->type == XML_SCHEMA_CTXT_VALIDATOR) {
	    xmlSchemaValidCtxtPtr vctxt = (xmlSchemaValidCtxtPtr) ctxt;
	    const char *file = NULL;
	    int col = 0;

	    /*
	    * Error node. If we specify a line number, then
	    * do not channel any node to the error function.
	    */
	    if (line == 0) {
		if ((node == NULL) &&
		    (vctxt->depth >= 0) &&
		    (vctxt->inode != NULL)) {
		    node = vctxt->inode->node;
		}
		/*
		* Get filename and line if no node-tree.
		*/
		if ((node == NULL) &&
		    (vctxt->parserCtxt != NULL) &&
		    (vctxt->parserCtxt->input != NULL)) {
		    file = vctxt->parserCtxt->input->filename;
                    if (vctxt->inode != NULL) {
		        line = vctxt->inode->nodeLine;
                        col = 0;
                    } else {
                        /* This is inaccurate. */
		        line = vctxt->parserCtxt->input->line;
		        col = vctxt->parserCtxt->input->col;
                    }
		}
	    }